

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O2

int main(void)

{
  undefined1 local_21;
  poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable> local_20;
  
  te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Circle,0ul>
            ((poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *)&local_20,&local_21);
  (**(code **)local_20.vtable.vtable_._M_t.
              super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
              super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
              super__Head_base<0UL,_void_**,_false>._M_head_impl)
            (local_20.storage.data_._M_t.
             super___uniq_ptr_impl<void,_te::v1::dynamic_storage::deleter>._M_t.
             super__Tuple_impl<0UL,_void_*,_te::v1::dynamic_storage::deleter>.
             super__Head_base<0UL,_void_*,_false>._M_head_impl,&std::cout);
  te::v1::poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable>::~poly(&local_20);
  te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Square,0ul>
            ((poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *)&local_20,&local_21);
  (**(code **)local_20.vtable.vtable_._M_t.
              super___uniq_ptr_impl<void_*,_std::default_delete<void_*[]>_>._M_t.
              super__Tuple_impl<0UL,_void_**,_std::default_delete<void_*[]>_>.
              super__Head_base<0UL,_void_**,_false>._M_head_impl)
            (local_20.storage.data_._M_t.
             super___uniq_ptr_impl<void,_te::v1::dynamic_storage::deleter>._M_t.
             super__Tuple_impl<0UL,_void_*,_te::v1::dynamic_storage::deleter>.
             super__Head_base<0UL,_void_*,_false>._M_head_impl,&std::cout);
  te::v1::poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable>::~poly(&local_20);
  return 0;
}

Assistant:

int main() {
  draw(Circle{});  // prints Circle
  draw(Square{});  // prints Square
}